

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

shared_ptr<vmips::VirtReg> __thiscall
vmips::CFGNode::append<vmips::move,std::shared_ptr<vmips::VirtReg>>
          (CFGNode *this,shared_ptr<vmips::VirtReg> *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::VirtReg> sVar1;
  shared_ptr<vmips::move> instr;
  __shared_ptr<vmips::move,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  vmips::VirtReg::create();
  std::make_shared<vmips::move,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>>
            ((shared_ptr<vmips::VirtReg> *)&_Stack_38,(shared_ptr<vmips::VirtReg> *)this);
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<vmips::move,void>
            (local_28,&_Stack_38);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(args + 3),(shared_ptr<vmips::Instruction> *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  sVar1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> append(Args &&...args) {
            auto ret = VirtReg::create();
            auto instr = std::make_shared<Instr>(ret, std::forward<Args>(args)...);
            instructions.push_back(instr);
            return ret;
        }